

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_ffh_assert(lua_State *L)

{
  GCstr *pGVar1;
  
  lj_lib_checkany(L,1);
  pGVar1 = lj_lib_optstr(L,2);
  if (pGVar1 == (GCstr *)0x0) {
    lj_err_caller(L,LJ_ERR_ASSERT);
  }
  lj_err_callermsg(L,(char *)(pGVar1 + 1));
}

Assistant:

LJLIB_ASM(assert)		LJLIB_REC(.)
{
  GCstr *s;
  lj_lib_checkany(L, 1);
  s = lj_lib_optstr(L, 2);
  if (s)
    lj_err_callermsg(L, strdata(s));
  else
    lj_err_caller(L, LJ_ERR_ASSERT);
  return FFH_UNREACHABLE;
}